

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O0

boolean linedup(xchar ax,xchar ay,xchar bx,xchar by)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  xchar by_local;
  xchar bx_local;
  xchar ay_local;
  xchar ax_local;
  
  tbx = ax - bx;
  tby = ay - by;
  if ((tbx == '\0') && (tby == '\0')) {
    return '\0';
  }
  if ((tbx != '\0') && (tby != '\0')) {
    iVar2 = (int)tbx;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    iVar3 = (int)tby;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (iVar2 != iVar3) {
      return '\0';
    }
  }
  iVar2 = distmin((int)tbx,(int)tby,0,0);
  if (iVar2 < 8) {
    if ((ax == u.ux) && (ay == u.uy)) {
      return viz_array[by][bx] & 1;
    }
    bVar1 = clear_path((int)ax,(int)ay,(int)bx,(int)by);
    if (bVar1 != '\0') {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean linedup(xchar ax, xchar ay, xchar bx, xchar by)
{
	tbx = ax - bx;	/* These two values are set for use */
	tby = ay - by;	/* after successful return.	    */

	/* sometimes displacement makes a monster think that you're at its
	   own location; prevent it from throwing and zapping in that case */
	if (!tbx && !tby) return FALSE;

	if ((!tbx || !tby || abs(tbx) == abs(tby)) /* straight line or diagonal */
	   && distmin(tbx, tby, 0, 0) < BOLT_LIM) {
	    if (ax == u.ux && ay == u.uy) return (boolean)(couldsee(bx,by));
	    else if (clear_path(ax,ay,bx,by)) return TRUE;
	}
	return FALSE;
}